

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# history.cpp
# Opt level: O0

char * __thiscall FHistory::Trim_filename(FHistory *this,char *s,int stops)

{
  char *pcVar1;
  size_t sVar2;
  int in_EDX;
  char *in_RSI;
  char *p;
  int l;
  char *local_20;
  int local_14;
  
  sVar2 = strlen(in_RSI);
  local_14 = in_EDX;
  pcVar1 = in_RSI + (int)sVar2;
  while (local_20 = pcVar1 + -1, local_14 != 0 && in_RSI < local_20) {
    pcVar1 = local_20;
    if ((*local_20 == '/') || (*local_20 == '\\')) {
      local_14 = local_14 + -1;
    }
  }
  if (local_14 == 0) {
    local_20 = pcVar1 + 1;
  }
  return local_20;
}

Assistant:

char *FHistory::Trim_filename(char *s, int stops) {

	int l   = strlen(s);
	char *p = s + l - 1;

	while ((stops) && (p > s)) {
		if ((*p == '/') || (*p == '\\')) stops--;
		p--;
	}
	if (!stops) p += 2;

	return p;
}